

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode Curl_GetFTPResponse(Curl_easy *data,ssize_t *nreadp,int *ftpcode)

{
  ssize_t *data_00;
  _Bool _Var1;
  int iVar2;
  timediff_t tVar3;
  size_t sVar4;
  uint *puVar5;
  curl_socket_t local_78;
  int ev;
  curl_socket_t wsock;
  timediff_t interval_ms;
  timediff_t timeout;
  int value_to_be_ignored;
  int cache_skip;
  size_t nread;
  pingpong *pp;
  ftp_conn *ftpc;
  CURLcode result;
  curl_socket_t sockfd;
  connectdata *conn;
  int *ftpcode_local;
  ssize_t *nreadp_local;
  Curl_easy *data_local;
  
  _result = data->conn;
  ftpc._4_4_ = _result->sock[0];
  ftpc._0_4_ = CURLE_OK;
  nread = (size_t)&_result->proto;
  timeout._4_4_ = 0;
  timeout._0_4_ = 0;
  pp = (pingpong *)nread;
  conn = (connectdata *)ftpcode;
  ftpcode_local = (int *)nreadp;
  nreadp_local = (ssize_t *)data;
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_ftp.log_level)) {
    Curl_trc_ftp(data,"getFTPResponse start");
  }
  if (conn == (connectdata *)0x0) {
    conn = (connectdata *)&timeout;
  }
  else {
    *(undefined4 *)&(conn->cpool_node)._list = 0;
  }
  ftpcode_local[0] = 0;
  ftpcode_local[1] = 0;
  do {
    while( true ) {
      if (*(int *)&(conn->cpool_node)._list != 0 || (CURLcode)ftpc != CURLE_OK) goto LAB_00139957;
      tVar3 = Curl_pp_state_timeout((Curl_easy *)nreadp_local,(pingpong *)nread,false);
      if (tVar3 < 1) {
        Curl_failf((Curl_easy *)nreadp_local,"FTP response timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      _ev = 1000;
      if (tVar3 < 1000) {
        _ev = tVar3;
      }
      sVar4 = Curl_dyn_len((dynbuf *)(nread + 0x60));
      if (((sVar4 != 0) && (timeout._4_4_ < 2)) ||
         (_Var1 = Curl_conn_data_pending((Curl_easy *)nreadp_local,0), _Var1)) break;
      _Var1 = Curl_pp_needs_flush((Curl_easy *)nreadp_local,(pingpong *)nread);
      if (_Var1) {
        local_78 = ftpc._4_4_;
      }
      else {
        local_78 = -1;
      }
      iVar2 = Curl_socket_check(ftpc._4_4_,-1,local_78,_ev);
      data_00 = nreadp_local;
      if (iVar2 < 0) {
        puVar5 = (uint *)__errno_location();
        Curl_failf((Curl_easy *)data_00,"FTP response aborted due to select/poll error: %d",
                   (ulong)*puVar5);
        return CURLE_RECV_ERROR;
      }
      if (iVar2 != 0) break;
      iVar2 = Curl_pgrsUpdate((Curl_easy *)nreadp_local);
      if (iVar2 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    _Var1 = Curl_pp_needs_flush((Curl_easy *)nreadp_local,(pingpong *)nread);
    if (_Var1) {
      ftpc._0_4_ = Curl_pp_flushsend((Curl_easy *)nreadp_local,(pingpong *)nread);
      if ((CURLcode)ftpc != CURLE_OK) goto LAB_00139957;
      ftpc._0_4_ = CURLE_OK;
    }
    ftpc._0_4_ = ftp_readresp((Curl_easy *)nreadp_local,0,(pingpong *)nread,(int *)conn,
                              (size_t *)&value_to_be_ignored);
    if ((CURLcode)ftpc != CURLE_OK) {
LAB_00139957:
      *(undefined1 *)(nread + 8) = 0;
      if (((nreadp_local != (ssize_t *)0x0) &&
          ((*(ulong *)((long)nreadp_local + 0xa9a) >> 0x1c & 1) != 0)) &&
         (((nreadp_local[0x265] == 0 || (0 < *(int *)(nreadp_local[0x265] + 8))) &&
          (0 < Curl_trc_feat_ftp.log_level)))) {
        Curl_trc_ftp((Curl_easy *)nreadp_local,"getFTPResponse -> result=%d, nread=%zd, ftpcode=%d",
                     (ulong)(CURLcode)ftpc,*(undefined8 *)ftpcode_local,
                     (ulong)*(uint *)&(conn->cpool_node)._list);
      }
      return (CURLcode)ftpc;
    }
    if ((_value_to_be_ignored == (void *)0x0) &&
       (sVar4 = Curl_dyn_len((dynbuf *)(nread + 0x60)), sVar4 != 0)) {
      timeout._4_4_ = timeout._4_4_ + 1;
    }
    else {
      timeout._4_4_ = 0;
    }
    *(long *)ftpcode_local = (long)_value_to_be_ignored + *(long *)ftpcode_local;
  } while( true );
}

Assistant:

CURLcode Curl_GetFTPResponse(struct Curl_easy *data,
                             ssize_t *nreadp, /* return number of bytes read */
                             int *ftpcode) /* return the ftp-code */
{
  /*
   * We cannot read just one byte per read() and then go back to select() as
   * the OpenSSL read() does not grok that properly.
   *
   * Alas, read as much as possible, split up into lines, use the ending
   * line in a response or continue reading.  */

  struct connectdata *conn = data->conn;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  size_t nread;
  int cache_skip = 0;
  int value_to_be_ignored = 0;

  CURL_TRC_FTP(data, "getFTPResponse start");

  if(ftpcode)
    *ftpcode = 0; /* 0 for errors */
  else
    /* make the pointer point to something for the rest of this function */
    ftpcode = &value_to_be_ignored;

  *nreadp = 0;

  while(!*ftpcode && !result) {
    /* check and reset timeout value every lap */
    timediff_t timeout = Curl_pp_state_timeout(data, pp, FALSE);
    timediff_t interval_ms;

    if(timeout <= 0) {
      failf(data, "FTP response timeout");
      return CURLE_OPERATION_TIMEDOUT; /* already too little time */
    }

    interval_ms = 1000;  /* use 1 second timeout intervals */
    if(timeout < interval_ms)
      interval_ms = timeout;

    /*
     * Since this function is blocking, we need to wait here for input on the
     * connection and only then we call the response reading function. We do
     * timeout at least every second to make the timeout check run.
     *
     * A caution here is that the ftp_readresp() function has a cache that may
     * contain pieces of a response from the previous invoke and we need to
     * make sure we do not just wait for input while there is unhandled data in
     * that cache. But also, if the cache is there, we call ftp_readresp() and
     * the cache was not good enough to continue we must not just busy-loop
     * around this function.
     *
     */

    if(Curl_dyn_len(&pp->recvbuf) && (cache_skip < 2)) {
      /*
       * There is a cache left since before. We then skipping the wait for
       * socket action, unless this is the same cache like the previous round
       * as then the cache was deemed not enough to act on and we then need to
       * wait for more data anyway.
       */
    }
    else if(!Curl_conn_data_pending(data, FIRSTSOCKET)) {
      curl_socket_t wsock = Curl_pp_needs_flush(data, pp) ?
        sockfd : CURL_SOCKET_BAD;
      int ev = Curl_socket_check(sockfd, CURL_SOCKET_BAD, wsock, interval_ms);
      if(ev < 0) {
        failf(data, "FTP response aborted due to select/poll error: %d",
              SOCKERRNO);
        return CURLE_RECV_ERROR;
      }
      else if(ev == 0) {
        if(Curl_pgrsUpdate(data))
          return CURLE_ABORTED_BY_CALLBACK;
        continue; /* just continue in our loop for the timeout duration */
      }
    }

    if(Curl_pp_needs_flush(data, pp)) {
      result = Curl_pp_flushsend(data, pp);
      if(result)
        break;
    }

    result = ftp_readresp(data, FIRSTSOCKET, pp, ftpcode, &nread);
    if(result)
      break;

    if(!nread && Curl_dyn_len(&pp->recvbuf))
      /* bump cache skip counter as on repeated skips we must wait for more
         data */
      cache_skip++;
    else
      /* when we got data or there is no cache left, we reset the cache skip
         counter */
      cache_skip = 0;

    *nreadp += nread;

  } /* while there is buffer left and loop is requested */

  pp->pending_resp = FALSE;
  CURL_TRC_FTP(data, "getFTPResponse -> result=%d, nread=%zd, ftpcode=%d",
               result, *nreadp, *ftpcode);

  return result;
}